

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * aux_upvalue(StkId fi,int n,TValue **val,CClosure **owner,UpVal **uv,ravi_type_map *type,
                  TString **usertype)

{
  CClosure *pCVar1;
  lua_CFunction p_Var2;
  long lVar3;
  long lVar4;
  ushort uVar5;
  StkId local_70;
  Proto *p;
  TString *name;
  LClosure *f_1;
  CClosure *f;
  ravi_type_map *type_local;
  UpVal **uv_local;
  CClosure **owner_local;
  TValue **val_local;
  int n_local;
  StkId fi_local;
  
  *type = 0xffffffff;
  *usertype = (TString *)0x0;
  uVar5 = fi->tt_ & 0x7f;
  if (uVar5 == 6) {
    if (fi->tt_ != 0x8006) {
      __assert_fail("((((fi))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x631,
                    "const char *aux_upvalue(StkId, int, TValue **, CClosure **, UpVal **, ravi_type_map *, TString **)"
                   );
    }
    if (((fi->value_).gc)->tt != '\x06') {
      __assert_fail("(((fi)->value_).gc)->tt == ((6) | ((0) << 4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x631,
                    "const char *aux_upvalue(StkId, int, TValue **, CClosure **, UpVal **, ravi_type_map *, TString **)"
                   );
    }
    p_Var2 = (fi->value_).f;
    lVar3 = *(long *)(p_Var2 + 0x18);
    if ((n < 1) || (*(int *)(lVar3 + 0x10) < n)) {
      fi_local = (StkId)0x0;
    }
    else {
      *val = (TValue *)**(undefined8 **)(p_Var2 + (long)(n + -1) * 8 + 0x20);
      if (uv != (UpVal **)0x0) {
        *uv = *(UpVal **)(p_Var2 + (long)(n + -1) * 8 + 0x20);
      }
      lVar4 = *(long *)(*(long *)(lVar3 + 0x58) + (long)(n + -1) * 0x18);
      *type = *(ravi_type_map *)(*(long *)(lVar3 + 0x58) + (long)(n + -1) * 0x18 + 0x10);
      *usertype = *(TString **)(*(long *)(lVar3 + 0x58) + (long)(n + -1) * 0x18 + 8);
      if (lVar4 == 0) {
        local_70 = (StkId)0x1a0477;
      }
      else {
        local_70 = (StkId)(lVar4 + 0x18);
      }
      fi_local = local_70;
    }
  }
  else if (uVar5 == 0x26) {
    if (fi->tt_ != 0x8026) {
      __assert_fail("((((fi))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x62a,
                    "const char *aux_upvalue(StkId, int, TValue **, CClosure **, UpVal **, ravi_type_map *, TString **)"
                   );
    }
    if (((fi->value_).gc)->tt != '&') {
      __assert_fail("(((fi)->value_).gc)->tt == ((6) | ((2) << 4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x62a,
                    "const char *aux_upvalue(StkId, int, TValue **, CClosure **, UpVal **, ravi_type_map *, TString **)"
                   );
    }
    pCVar1 = (CClosure *)(fi->value_).f;
    if ((n < 1) || ((int)(uint)pCVar1->nupvalues < n)) {
      fi_local = (StkId)0x0;
    }
    else {
      *val = pCVar1->upvalue + (n + -1);
      if (owner != (CClosure **)0x0) {
        *owner = pCVar1;
      }
      fi_local = (StkId)0x19cd7a;
    }
  }
  else {
    fi_local = (StkId)0x0;
  }
  return (char *)fi_local;
}

Assistant:

static const char *aux_upvalue (StkId fi, int n, TValue **val,
                                CClosure **owner, UpVal **uv, ravi_type_map *type, TString **usertype) {
  *type = RAVI_TM_ANY;
  *usertype = NULL;
  switch (ttype(fi)) {
    case LUA_TCCL: {  /* C closure */
      CClosure *f = clCvalue(fi);
      if (!(1 <= n && n <= f->nupvalues)) return NULL;
      *val = &f->upvalue[n-1];
      if (owner) *owner = f;
      return "";
    }
    case LUA_TLCL: {  /* Lua closure */
      LClosure *f = clLvalue(fi);
      TString *name;
      Proto *p = f->p;
      if (!(1 <= n && n <= p->sizeupvalues)) return NULL;
      *val = f->upvals[n-1]->v;
      if (uv) *uv = f->upvals[n - 1];
      name = p->upvalues[n-1].name;
      *type = p->upvalues[n - 1].ravi_type_map;
      *usertype = p->upvalues[n - 1].usertype;
      return (name == NULL) ? "(*no name)" : getstr(name);
    }
    default: return NULL;  /* not a closure */
  }
}